

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

void __thiscall cornerstone::raft_server::invite_srv_to_join_cluster(raft_server *this)

{
  int32 iVar1;
  int32 iVar2;
  element_type *peVar3;
  _func_int **pp_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ptr<req_msg> req;
  cluster_config local_68;
  shared_ptr<cornerstone::log_entry> local_40;
  
  peVar3 = (this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar5 = *(undefined4 *)&peVar3->term_;
  uVar6 = *(undefined4 *)((long)&peVar3->term_ + 4);
  iVar1 = ((((this->srv_to_join_).super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->config_).
           super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
  iVar7 = (*((this->log_store_).
             super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_log_store[2])();
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00176788;
  local_68.servers_.
  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)(p_Var8 + 1);
  iVar2 = this->id_;
  pp_Var4 = (_func_int **)this->quick_commit_idx_;
  p_Var8[1]._M_use_count = uVar5;
  p_Var8[1]._M_weak_count = uVar6;
  *(undefined4 *)&p_Var8[2]._vptr__Sp_counted_base = 0xc;
  *(int32 *)((long)&p_Var8[2]._vptr__Sp_counted_base + 4) = iVar2;
  p_Var8[2]._M_use_count = iVar1;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_001767d8;
  p_Var8[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(long *)&p_Var8[3]._M_use_count = CONCAT44(extraout_var,iVar7) + -1;
  p_Var8[4]._vptr__Sp_counted_base = pp_Var4;
  p_Var8[4]._M_use_count = 0;
  p_Var8[4]._M_weak_count = 0;
  p_Var8[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[5]._M_use_count = 0;
  p_Var8[5]._M_weak_count = 0;
  pp_Var4 = (_func_int **)
            ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->term_;
  local_68.servers_.
  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ._M_impl._M_node._M_size = (size_t)p_Var8;
  cluster_config::serialize(&local_68);
  local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_M_use_count = 1;
  (local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_M_weak_count = 1;
  (local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00176820;
  local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = pp_Var4;
  local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._M_use_count = 2;
  local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [2]._vptr__Sp_counted_base = (_func_int **)local_68.log_idx_;
  local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [2]._M_use_count = (undefined4)local_68.prev_log_idx_;
  local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [2]._M_weak_count = local_68.prev_log_idx_._4_4_;
  local_68.prev_log_idx_ = 0;
  local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [3]._vptr__Sp_counted_base = (_func_int **)0x0;
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,std::allocator<std::shared_ptr<cornerstone::log_entry>>>
  ::emplace_back<std::shared_ptr<cornerstone::log_entry>>
            ((vector<std::shared_ptr<cornerstone::log_entry>,std::allocator<std::shared_ptr<cornerstone::log_entry>>>
              *)&p_Var8[4]._M_use_count,&local_40);
  if (local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_68.prev_log_idx_ != 0) {
    (*(code *)local_68.log_idx_)();
  }
  peer::send_req((this->srv_to_join_).
                 super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (ptr<req_msg> *)
                 &local_68.servers_.
                  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev,&this->ex_resp_handler_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_68.servers_.
      super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
      ._M_impl._M_node._M_size != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.servers_.
               super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
               ._M_impl._M_node._M_size);
  }
  return;
}

Assistant:

void raft_server::invite_srv_to_join_cluster()
{
    ptr<req_msg> req(cs_new<req_msg>(
        state_->get_term(),
        msg_type::join_cluster_request,
        id_,
        srv_to_join_->get_id(),
        0L,
        log_store_->next_slot() - 1,
        quick_commit_idx_));
    req->log_entries().push_back(cs_new<log_entry>(state_->get_term(), config_->serialize(), log_val_type::conf));
    srv_to_join_->send_req(req, ex_resp_handler_);
}